

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS
ref_metric_belme_gfe
          (REF_DBL *metric,REF_GRID ref_grid,REF_INT ldim,REF_DBL *prim_dual,
          REF_RECON_RECONSTRUCTION reconstruction)

{
  REF_NODE pRVar1;
  uint uVar2;
  REF_DBL *scalar;
  REF_DBL *grad;
  REF_DBL *scalar_00;
  REF_DBL *hessian;
  int iVar3;
  double local_120;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT ref_malloc_init_i_3;
  REF_INT ref_malloc_init_i_2;
  REF_INT ref_malloc_init_i_1;
  REF_INT ref_malloc_init_i;
  REF_DBL *hess_flux;
  REF_DBL *flux;
  REF_DBL *grad_lam;
  REF_DBL *lam;
  REF_DBL direction [3];
  REF_DBL local_b8;
  REF_DBL node_flux [5];
  REF_DBL local_88;
  REF_DBL state [5];
  int local_50;
  REF_INT nequ;
  REF_INT i;
  REF_INT node;
  REF_INT dir;
  REF_INT var;
  REF_NODE ref_node;
  REF_RECON_RECONSTRUCTION reconstruction_local;
  REF_DBL *prim_dual_local;
  REF_INT ldim_local;
  REF_GRID ref_grid_local;
  REF_DBL *metric_local;
  
  pRVar1 = ref_grid->node;
  if (pRVar1->max < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0xa87,
           "ref_metric_belme_gfe","malloc lam of REF_DBL negative");
    metric_local._4_4_ = 1;
  }
  else {
    scalar = (REF_DBL *)malloc((long)pRVar1->max << 3);
    if (scalar == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0xa87,"ref_metric_belme_gfe","malloc lam of REF_DBL NULL");
      metric_local._4_4_ = 2;
    }
    else {
      for (ref_malloc_init_i_2 = 0; ref_malloc_init_i_2 < pRVar1->max;
          ref_malloc_init_i_2 = ref_malloc_init_i_2 + 1) {
        scalar[ref_malloc_init_i_2] = 0.0;
      }
      if (pRVar1->max * 3 < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0xa88,"ref_metric_belme_gfe","malloc grad_lam of REF_DBL negative");
        metric_local._4_4_ = 1;
      }
      else {
        grad = (REF_DBL *)malloc((long)(pRVar1->max * 3) << 3);
        if (grad == (REF_DBL *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0xa88,"ref_metric_belme_gfe","malloc grad_lam of REF_DBL NULL");
          metric_local._4_4_ = 2;
        }
        else {
          for (ref_malloc_init_i_3 = 0;
              SBORROW4(ref_malloc_init_i_3,pRVar1->max * 3) !=
              ref_malloc_init_i_3 + pRVar1->max * -3 < 0;
              ref_malloc_init_i_3 = ref_malloc_init_i_3 + 1) {
            grad[ref_malloc_init_i_3] = 0.0;
          }
          if (pRVar1->max < 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0xa89,"ref_metric_belme_gfe","malloc flux of REF_DBL negative");
            metric_local._4_4_ = 1;
          }
          else {
            scalar_00 = (REF_DBL *)malloc((long)pRVar1->max << 3);
            if (scalar_00 == (REF_DBL *)0x0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0xa89,"ref_metric_belme_gfe","malloc flux of REF_DBL NULL");
              metric_local._4_4_ = 2;
            }
            else {
              for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < pRVar1->max;
                  ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
                scalar_00[ref_private_macro_code_rss] = 0.0;
              }
              if (pRVar1->max * 6 < 0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0xa8a,"ref_metric_belme_gfe","malloc hess_flux of REF_DBL negative");
                metric_local._4_4_ = 1;
              }
              else {
                hessian = (REF_DBL *)malloc((long)(pRVar1->max * 6) << 3);
                if (hessian == (REF_DBL *)0x0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                         ,0xa8a,"ref_metric_belme_gfe","malloc hess_flux of REF_DBL NULL");
                  metric_local._4_4_ = 2;
                }
                else {
                  for (ref_private_macro_code_rss_1 = 0;
                      SBORROW4(ref_private_macro_code_rss_1,pRVar1->max * 6) !=
                      ref_private_macro_code_rss_1 + pRVar1->max * -6 < 0;
                      ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
                    hessian[ref_private_macro_code_rss_1] = 0.0;
                  }
                  for (node = 0; node < 5; node = node + 1) {
                    for (nequ = 0; nequ < pRVar1->max; nequ = nequ + 1) {
                      if (((-1 < nequ) && (nequ < pRVar1->max)) && (-1 < pRVar1->global[nequ])) {
                        scalar[nequ] = prim_dual[node + ldim / 2 + ldim * nequ];
                      }
                    }
                    uVar2 = ref_recon_gradient(ref_grid,scalar,grad,reconstruction);
                    if (uVar2 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                             ,0xa93,"ref_metric_belme_gfe",(ulong)uVar2,"grad_lam");
                      return uVar2;
                    }
                    for (i = 0; i < 3; i = i + 1) {
                      for (nequ = 0; nequ < pRVar1->max; nequ = nequ + 1) {
                        if (((-1 < nequ) && (nequ < pRVar1->max)) && (-1 < pRVar1->global[nequ])) {
                          lam = (REF_DBL *)0x0;
                          direction[0] = 0.0;
                          direction[1] = 0.0;
                          direction[(long)i + -1] = 1.0;
                          for (local_50 = 0; local_50 < 5; local_50 = local_50 + 1) {
                            state[(long)local_50 + -1] = prim_dual[local_50 + ldim * nequ];
                          }
                          uVar2 = ref_phys_euler(&local_88,(REF_DBL *)&lam,&local_b8);
                          if (uVar2 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                   ,0xa9d,"ref_metric_belme_gfe",(ulong)uVar2,"euler");
                            return uVar2;
                          }
                          scalar_00[nequ] = node_flux[(long)node + -1];
                        }
                      }
                      uVar2 = ref_recon_hessian(ref_grid,scalar_00,hessian,reconstruction);
                      if (uVar2 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                               ,0xaa0,"ref_metric_belme_gfe",(ulong)uVar2,"hess");
                        return uVar2;
                      }
                      for (nequ = 0; nequ < pRVar1->max; nequ = nequ + 1) {
                        if (((-1 < nequ) && (nequ < pRVar1->max)) && (-1 < pRVar1->global[nequ])) {
                          for (local_50 = 0; local_50 < 6; local_50 = local_50 + 1) {
                            if (grad[i + nequ * 3] <= 0.0) {
                              local_120 = -grad[i + nequ * 3];
                            }
                            else {
                              local_120 = grad[i + nequ * 3];
                            }
                            iVar3 = local_50 + nequ * 6;
                            metric[iVar3] = local_120 * hessian[local_50 + nequ * 6] + metric[iVar3]
                            ;
                          }
                        }
                      }
                    }
                  }
                  for (nequ = 0; nequ < pRVar1->max; nequ = nequ + 1) {
                    if ((((-1 < nequ) && (nequ < pRVar1->max)) && (-1 < pRVar1->global[nequ])) &&
                       (uVar2 = ref_matrix_healthy_m(metric + nequ * 6), uVar2 != 0)) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                             ,0xaab,"ref_metric_belme_gfe",(ulong)uVar2,"euler-opt-goal");
                      return uVar2;
                    }
                  }
                  if (hessian != (REF_DBL *)0x0) {
                    free(hessian);
                  }
                  if (scalar_00 != (REF_DBL *)0x0) {
                    free(scalar_00);
                  }
                  if (grad != (REF_DBL *)0x0) {
                    free(grad);
                  }
                  if (scalar != (REF_DBL *)0x0) {
                    free(scalar);
                  }
                  metric_local._4_4_ = 0;
                }
              }
            }
          }
        }
      }
    }
  }
  return metric_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_metric_belme_gfe(
    REF_DBL *metric, REF_GRID ref_grid, REF_INT ldim, REF_DBL *prim_dual,
    REF_RECON_RECONSTRUCTION reconstruction) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT var, dir, node, i;
  REF_INT nequ;
  REF_DBL state[5], node_flux[5], direction[3];
  REF_DBL *lam, *grad_lam, *flux, *hess_flux;
  ref_malloc_init(lam, ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(grad_lam, 3 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(flux, ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(hess_flux, 6 * ref_node_max(ref_node), REF_DBL, 0.0);

  nequ = ldim / 2;

  for (var = 0; var < 5; var++) {
    each_ref_node_valid_node(ref_node, node) {
      lam[node] = prim_dual[var + 1 * nequ + ldim * node];
    }
    RSS(ref_recon_gradient(ref_grid, lam, grad_lam, reconstruction),
        "grad_lam");
    for (dir = 0; dir < 3; dir++) {
      each_ref_node_valid_node(ref_node, node) {
        direction[0] = 0.0;
        direction[1] = 0.0;
        direction[2] = 0.0;
        direction[dir] = 1.0;
        for (i = 0; i < 5; i++) {
          state[i] = prim_dual[i + 0 * nequ + ldim * node];
        }
        RSS(ref_phys_euler(state, direction, node_flux), "euler");
        flux[node] = node_flux[var];
      }
      RSS(ref_recon_hessian(ref_grid, flux, hess_flux, reconstruction), "hess");
      each_ref_node_valid_node(ref_node, node) {
        for (i = 0; i < 6; i++) {
          metric[i + 6 * node] +=
              ABS(grad_lam[dir + 3 * node]) * hess_flux[i + 6 * node];
        }
      }
    }
  }

  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_matrix_healthy_m(&(metric[6 * node])), "euler-opt-goal");
  }

  ref_free(hess_flux);
  ref_free(flux);
  ref_free(grad_lam);
  ref_free(lam);

  return REF_SUCCESS;
}